

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::ReadNodeChannels(BVHLoader *this,Node *pNode)

{
  bool bVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_00;
  float fVar3;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_90;
  value_type local_6c [9];
  undefined1 local_48 [8];
  string channelToken;
  uint a;
  uint numChannels;
  float numChannelsFloat;
  Node *pNode_local;
  BVHLoader *this_local;
  
  fVar3 = GetNextTokenAsFloat(this);
  channelToken.field_2._12_4_ = 0;
  do {
    if ((uint)(long)fVar3 <= (uint)channelToken.field_2._12_4_) {
      return;
    }
    GetNextToken_abi_cxx11_((string *)local_48,this);
    bVar1 = std::operator==((string *)local_48,"Xposition");
    if (bVar1) {
      local_6c[5] = 0;
      std::vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>::
      push_back(&pNode->mChannels,local_6c + 5);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"Yposition");
      if (bVar1) {
        local_6c[4] = 1;
        std::vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
        ::push_back(&pNode->mChannels,local_6c + 4);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"Zposition");
        if (bVar1) {
          local_6c[3] = 2;
          std::
          vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>::
          push_back(&pNode->mChannels,local_6c + 3);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"Xrotation");
          if (bVar1) {
            local_6c[2] = 3;
            std::
            vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
            ::push_back(&pNode->mChannels,local_6c + 2);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"Yrotation");
            if (bVar1) {
              local_6c[1] = 4;
              std::
              vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
              ::push_back(&pNode->mChannels,local_6c + 1);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_48,"Zrotation");
              if (!bVar1) {
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter(&local_208);
                pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_208,(char (*) [28])"Invalid channel specifier \"");
                pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_48);
                this_00 = (basic_formatter *)
                          Formatter::
                          basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                          operator<<(pbVar2,(char (*) [3])0xbb58f8);
                Formatter::basic_formatter::operator_cast_to_string(&local_90,this_00);
                ThrowException(this,&local_90);
              }
              local_6c[0] = Channel_RotationZ;
              std::
              vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
              ::push_back(&pNode->mChannels,local_6c);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_48);
    channelToken.field_2._12_4_ = channelToken.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void BVHLoader::ReadNodeChannels( BVHLoader::Node& pNode)
{
    // number of channels. Use the float reader because we're lazy
    float numChannelsFloat = GetNextTokenAsFloat();
    unsigned int numChannels = (unsigned int) numChannelsFloat;

    for( unsigned int a = 0; a < numChannels; a++)
    {
        std::string channelToken = GetNextToken();

        if( channelToken == "Xposition")
            pNode.mChannels.push_back( Channel_PositionX);
        else if( channelToken == "Yposition")
            pNode.mChannels.push_back( Channel_PositionY);
        else if( channelToken == "Zposition")
            pNode.mChannels.push_back( Channel_PositionZ);
        else if( channelToken == "Xrotation")
            pNode.mChannels.push_back( Channel_RotationX);
        else if( channelToken == "Yrotation")
            pNode.mChannels.push_back( Channel_RotationY);
        else if( channelToken == "Zrotation")
            pNode.mChannels.push_back( Channel_RotationZ);
        else
            ThrowException( format() << "Invalid channel specifier \"" << channelToken << "\"." );
    }
}